

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O1

bool __thiscall irr::scene::CB3DMeshFileLoader::load(CB3DMeshFileLoader *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  void *pvVar2;
  iterator iVar3;
  pointer pSVar4;
  pointer pSVar5;
  pointer piVar6;
  pointer piVar7;
  double dVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  undefined4 extraout_var_02;
  s32 sVar12;
  bool bVar13;
  void *__src;
  long lVar14;
  undefined4 extraout_XMM0_Da;
  c8 extraout_XMM0_Da_00 [4];
  c8 acVar15 [4];
  undefined4 extraout_XMM0_Db;
  s32 extraout_XMM0_Db_00;
  SB3dChunkHeader header;
  s32 fileVersion;
  c8 local_60 [4];
  int local_5c;
  vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_> local_58;
  undefined1 local_34 [4];
  
  pvVar2 = *(void **)&(this->super_IMeshLoader).field_0x8;
  lVar14 = *(long *)&(this->super_IMeshLoader).field_0x18;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x8 = 0;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,lVar14 - (long)pvVar2);
  }
  this->field_0x20 = 1;
  this->NormalsInFile = false;
  this->HasVertexColors = false;
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_60,8);
  if (local_60 == (c8  [4])0x44334242) {
    this_00 = &(this->super_IMeshLoader).field_0x8;
    iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(CONCAT44(extraout_var,iVar10) + -8);
    sVar12 = 8;
    if (8 < local_5c + 8) {
      sVar12 = local_5c + 8;
    }
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(sVar12,local_60);
    iVar3._M_current = *(SB3dChunk **)&(this->super_IMeshLoader).field_0x10;
    if (iVar3._M_current == *(SB3dChunk **)&(this->super_IMeshLoader).field_0x18) {
      ::std::vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>::
      _M_realloc_insert<irr::scene::SB3dChunk>
                ((vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_> *)this_00,
                 iVar3,(SB3dChunk *)&local_58);
    }
    else {
      *&(iVar3._M_current)->name = local_60;
      (iVar3._M_current)->length = sVar12;
      (iVar3._M_current)->startposition =
           (long)local_58.
                 super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = &(this->super_IMeshLoader).field_0x10;
      *(long *)puVar1 = *(long *)puVar1 + 0x10;
    }
    this->field_0x20 = 0;
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_34,4);
    lVar14 = *(long *)&(this->super_IMeshLoader).field_0x10;
    lVar14 = (long)*(int *)(lVar14 + -0xc) + *(long *)(lVar14 + -8);
    iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
    bVar13 = lVar14 <= CONCAT44(extraout_var_00,iVar10);
    if (CONCAT44(extraout_var_00,iVar10) < lVar14) {
      do {
        (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_60,8);
        iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
        local_58.
        super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(CONCAT44(extraout_var_01,iVar10) + -8)
        ;
        sVar12 = local_5c + 8;
        if (sVar12 < 9) {
          sVar12 = 8;
        }
        local_58.
        super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(sVar12,local_60);
        iVar3._M_current = *(SB3dChunk **)&(this->super_IMeshLoader).field_0x10;
        if (iVar3._M_current == *(SB3dChunk **)&(this->super_IMeshLoader).field_0x18) {
          ::std::vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>::
          _M_realloc_insert<irr::scene::SB3dChunk>
                    ((vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_> *)
                     this_00,iVar3,(SB3dChunk *)&local_58);
          acVar15 = extraout_XMM0_Da_00;
          sVar12 = extraout_XMM0_Db_00;
        }
        else {
          *&(iVar3._M_current)->name = local_60;
          (iVar3._M_current)->length = sVar12;
          (iVar3._M_current)->startposition =
               (long)local_58.
                     super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          puVar1 = &(this->super_IMeshLoader).field_0x10;
          *(long *)puVar1 = *(long *)puVar1 + 0x10;
          acVar15 = local_60;
        }
        this->field_0x20 = 0;
        iVar10 = *(int *)(*(long *)&(this->super_IMeshLoader).field_0x10 + -0x10);
        if (iVar10 == 0x45444f4e) {
          bVar9 = readChunkNODE(this,(SJoint *)0x0);
          if (!bVar9) {
            return bVar13;
          }
        }
        else if (iVar10 == 0x53555242) {
          readChunkBRUS(this);
        }
        else if (iVar10 == 0x53584554) {
          readChunkTEXS(this);
        }
        else {
          dVar8 = os::Printer::log((Printer *)"Unknown chunk found in mesh base - skipping",
                                   (double)CONCAT44(sVar12,acVar15));
          lVar14 = *(long *)&(this->super_IMeshLoader).field_0x10;
          iVar10 = (*this->B3DFile->_vptr_IReadFile[1])
                             (SUB84(dVar8,0),this->B3DFile,
                              (long)*(int *)(lVar14 + -0xc) + *(long *)(lVar14 + -8),0);
          if ((char)iVar10 == '\0') {
            return bVar13;
          }
          lVar14 = *(long *)&(this->super_IMeshLoader).field_0x8;
          pvVar2 = *(void **)&(this->super_IMeshLoader).field_0x10;
          uVar11 = (long)pvVar2 + (0xffffffff0 - lVar14) & 0xffffffff0;
          __src = (void *)(lVar14 + uVar11 + 0x10);
          if (__src != pvVar2) {
            memmove((void *)(lVar14 + uVar11),__src,(long)pvVar2 - (long)__src);
          }
          puVar1 = &(this->super_IMeshLoader).field_0x10;
          *(long *)puVar1 = *(long *)puVar1 + -0x10;
        }
        lVar14 = *(long *)&(this->super_IMeshLoader).field_0x10;
        lVar14 = (long)*(int *)(lVar14 + -0xc) + *(long *)(lVar14 + -8);
        iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
        bVar13 = lVar14 <= CONCAT44(extraout_var_02,iVar10);
      } while (CONCAT44(extraout_var_02,iVar10) < lVar14);
    }
    pvVar2 = *(void **)&(this->super_IMeshLoader).field_0x8;
    lVar14 = *(long *)&(this->super_IMeshLoader).field_0x18;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,lVar14 - (long)pvVar2);
    }
    this->field_0x20 = 1;
    pSVar4 = (this->BaseVertices).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->BaseVertices).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pSVar4 != (pointer)0x0) {
      operator_delete(pSVar4,(long)pSVar5 - (long)pSVar4);
    }
    (this->BaseVertices).is_sorted = true;
    piVar6 = (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar7 = (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6,(long)piVar7 - (long)piVar6);
    }
    (this->AnimatedVertices_VertexID).is_sorted = true;
    piVar6 = (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar7 = (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6,(long)piVar7 - (long)piVar6);
    }
    (this->AnimatedVertices_BufferID).is_sorted = true;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>::~vector
              (&local_58);
    (this->Materials).is_sorted = true;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>::~vector
              ((vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_> *)
               &local_58);
    (this->Textures).is_sorted = true;
  }
  else {
    (*this->B3DFile->_vptr_IReadFile[4])();
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool CB3DMeshFileLoader::load()
{
	B3dStack.clear();

	NormalsInFile = false;
	HasVertexColors = false;

	//------ Get header ------

	SB3dChunkHeader header;
	B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
	header.size = os::Byteswap::byteswap(header.size);
#endif

	if (strncmp(header.name, "BB3D", 4) != 0) {
		os::Printer::log("File is not a b3d file. Loading failed (No header found)", B3DFile->getFileName(), ELL_ERROR);
		return false;
	}

	// Add main chunk...
	B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

	// Get file version, but ignore it, as it's not important with b3d files...
	s32 fileVersion;
	B3DFile->read(&fileVersion, sizeof(fileVersion));
#ifdef __BIG_ENDIAN__
	fileVersion = os::Byteswap::byteswap(fileVersion);
#endif

	//------ Read main chunk ------

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) {
		B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
		header.size = os::Byteswap::byteswap(header.size);
#endif
		B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

		if (strncmp(B3dStack.getLast().name, "TEXS", 4) == 0) {
			if (!readChunkTEXS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "BRUS", 4) == 0) {
			if (!readChunkBRUS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "NODE", 4) == 0) {
			if (!readChunkNODE((CSkinnedMesh::SJoint *)0))
				return false;
		} else {
			os::Printer::log("Unknown chunk found in mesh base - skipping");
			if (!B3DFile->seek(B3dStack.getLast().startposition + B3dStack.getLast().length))
				return false;
			B3dStack.erase(B3dStack.size() - 1);
		}
	}

	B3dStack.clear();

	BaseVertices.clear();
	AnimatedVertices_VertexID.clear();
	AnimatedVertices_BufferID.clear();

	Materials.clear();
	Textures.clear();

	return true;
}